

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O2

double EDCircles::ComputeEllipseError(EllipseEquation *eq,double *px,double *py,int noPoints)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double minor;
  double major;
  double yc;
  double xc;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  
  dVar10 = eq->coeff[1];
  dVar1 = eq->coeff[2];
  dVar2 = eq->coeff[3];
  dVar3 = eq->coeff[4];
  dVar4 = eq->coeff[5];
  dVar5 = eq->coeff[6];
  ComputeEllipseCenterAndAxisLengths(eq,&local_30,&local_38,&local_40,&local_48);
  dVar14 = dVar2 + dVar2;
  uVar8 = 0;
  uVar9 = 0;
  if (0 < noPoints) {
    uVar9 = (ulong)(uint)noPoints;
  }
  dVar11 = 0.0;
  for (; uVar8 != uVar9; uVar8 = uVar8 + 1) {
    dVar6 = px[uVar8];
    dVar12 = dVar6 - local_30;
    dVar7 = py[uVar8];
    dVar20 = dVar7 - local_38;
    if (ABS(dVar12) <= ABS(dVar20)) {
      dVar12 = dVar12 / dVar20;
      dVar13 = local_30 - dVar12 * local_38;
      dVar17 = dVar3 * dVar12 + (dVar10 + dVar10) * dVar12 * dVar13 + dVar1 * dVar13 + dVar4;
      dVar21 = dVar10 * dVar12 * dVar12 + dVar1 * dVar12 + dVar2;
      dVar15 = dVar17 * dVar17 + (dVar10 * dVar13 * dVar13 + dVar3 * dVar13 + dVar5) * dVar21 * -4.0
      ;
      dVar20 = 0.0;
      if (0.0 <= dVar15) {
        dVar20 = dVar15;
      }
      auVar19._0_8_ = -(dVar17 + SQRT(dVar20));
      auVar19._8_8_ = -(dVar17 - SQRT(dVar20));
      auVar23._8_8_ = dVar21 + dVar21;
      auVar23._0_8_ = dVar21 + dVar21;
      auVar23 = divpd(auVar19,auVar23);
      dVar20 = dVar12 * auVar23._0_8_ + dVar13;
      dVar13 = dVar12 * auVar23._8_8_ + dVar13;
      dVar17 = dVar6 - dVar20;
      dVar21 = dVar6 - dVar13;
      dVar12 = dVar7 - auVar23._0_8_;
      dVar15 = dVar7 - auVar23._8_8_;
      dVar12 = dVar17 * dVar17 + dVar12 * dVar12;
      dVar15 = dVar21 * dVar21 + dVar15 * dVar15;
      dVar13 = (double)(~-(ulong)(dVar12 < dVar15) & (ulong)dVar13 |
                       -(ulong)(dVar12 < dVar15) & (ulong)dVar20);
      dVar20 = dVar13;
      if (dVar15 <= dVar12) {
        dVar12 = dVar15;
      }
    }
    else {
      dVar20 = dVar20 / dVar12;
      dVar13 = local_38 - dVar20 * local_30;
      dVar15 = dVar2 * dVar20 * dVar20 + dVar1 * dVar20 + dVar10;
      dVar21 = dVar4 * dVar20 + dVar1 * dVar13 + dVar14 * dVar20 * dVar13 + dVar3;
      dVar17 = dVar21 * dVar21 + dVar15 * -4.0 * (dVar2 * dVar13 * dVar13 + dVar4 * dVar13 + dVar5);
      dVar12 = 0.0;
      if (0.0 <= dVar17) {
        dVar12 = dVar17;
      }
      auVar16._0_8_ = dVar15 + dVar15;
      auVar22._0_8_ = -(dVar21 + SQRT(dVar12));
      auVar22._8_8_ = -(dVar21 - SQRT(dVar12));
      auVar16._8_8_ = auVar16._0_8_;
      auVar23 = divpd(auVar22,auVar16);
      dVar17 = auVar23._0_8_;
      dVar21 = auVar23._8_8_;
      dVar12 = dVar7 - (dVar20 * dVar17 + dVar13);
      dVar20 = dVar7 - (dVar20 * dVar21 + dVar13);
      dVar12 = (dVar6 - dVar17) * (dVar6 - dVar17) + dVar12 * dVar12;
      dVar15 = (dVar6 - dVar21) * (dVar6 - dVar21) + dVar20 * dVar20;
      dVar13 = (double)(~-(ulong)(dVar12 < dVar15) & (ulong)dVar21 |
                       -(ulong)(dVar12 < dVar15) & (ulong)dVar17);
      dVar20 = dVar13;
      if (dVar15 <= dVar12) {
        dVar12 = dVar15;
      }
    }
    do {
      dVar15 = dVar12;
      dVar13 = dVar13 + 0.5;
      dVar21 = dVar1 * dVar13 + dVar4;
      dVar12 = dVar21 * dVar21 + (dVar10 * dVar13 * dVar13 + dVar3 * dVar13 + dVar5) * dVar2 * -4.0;
      dVar17 = 0.0;
      if (0.0 <= dVar12) {
        dVar17 = dVar12;
      }
      dVar12 = (dVar21 + SQRT(dVar17)) / dVar14 + dVar7;
      dVar18 = (dVar6 - dVar13) * (dVar6 - dVar13);
      dVar12 = dVar12 * dVar12 + dVar18;
    } while ((dVar12 <= dVar15) ||
            (dVar12 = (dVar21 - SQRT(dVar17)) / dVar14 + dVar7, dVar12 = dVar18 + dVar12 * dVar12,
            dVar12 <= dVar15));
    do {
      dVar13 = dVar15;
      dVar20 = dVar20 + -0.5;
      dVar17 = dVar1 * dVar20 + dVar4;
      dVar15 = dVar17 * dVar17 + (dVar10 * dVar20 * dVar20 + dVar3 * dVar20 + dVar5) * dVar2 * -4.0;
      dVar12 = 0.0;
      if (0.0 <= dVar15) {
        dVar12 = dVar15;
      }
      dVar15 = (dVar17 + SQRT(dVar12)) / dVar14 + dVar7;
      dVar21 = (dVar6 - dVar20) * (dVar6 - dVar20);
      dVar15 = dVar15 * dVar15 + dVar21;
    } while ((dVar15 <= dVar13) ||
            (dVar12 = (dVar17 - SQRT(dVar12)) / dVar14 + dVar7, dVar15 = dVar21 + dVar12 * dVar12,
            dVar15 <= dVar13));
    dVar11 = dVar11 + dVar13;
  }
  dVar11 = dVar11 / (double)noPoints;
  if (dVar11 < 0.0) {
    dVar10 = sqrt(dVar11);
    return dVar10;
  }
  return SQRT(dVar11);
}

Assistant:

double EDCircles::ComputeEllipseError(EllipseEquation * eq, double * px, double * py, int noPoints)
{
	double error = 0;

	double A = eq->A();
	double B = eq->B();
	double C = eq->C();
	double D = eq->D();
	double E = eq->E();
	double F = eq->F();

	double xc, yc, major, minor;
	ComputeEllipseCenterAndAxisLengths(eq, &xc, &yc, &major, &minor);

	for (int i = 0; i<noPoints; i++) {
		double dx = px[i] - xc;
		double dy = py[i] - yc;

		double min;
		double xs, ys;

		if (fabs(dx) > fabs(dy)) {
			// The line equation is of the form: y = mx+n
			double m = dy / dx;
			double n = yc - m*xc;

			// a*x^2 + b*x + c
			double a = A + B*m + C*m*m;
			double b = B*n + 2 * C*m*n + D + E*m;
			double c = C*n*n + E*n + F;
			double det = b*b - 4 * a*c;
			if (det<0) det = 0;
			double x1 = -(b + sqrt(det)) / (2 * a);
			double x2 = -(b - sqrt(det)) / (2 * a);

			double y1 = m*x1 + n;
			double y2 = m*x2 + n;

			dx = px[i] - x1;
			dy = py[i] - y1;
			double d1 = dx*dx + dy*dy;

			dx = px[i] - x2;
			dy = py[i] - y2;
			double d2 = dx*dx + dy*dy;

			if (d1<d2) { min = d1; xs = x1; ys = y1; }
			else { min = d2; xs = x2; ys = y2; }

		}
		else {
			// The line equation is of the form: x = my+n
			double m = dx / dy;
			double n = xc - m*yc;

			// a*y^2 + b*y + c
			double a = A*m*m + B*m + C;
			double b = 2 * A*m*n + B*n + D*m + E;
			double c = A*n*n + D*n + F;
			double det = b*b - 4 * a*c;
			if (det<0) det = 0;
			double y1 = -(b + sqrt(det)) / (2 * a);
			double y2 = -(b - sqrt(det)) / (2 * a);

			double x1 = m*y1 + n;
			double x2 = m*y2 + n;

			dx = px[i] - x1;
			dy = py[i] - y1;
			double d1 = dx*dx + dy*dy;

			dx = px[i] - x2;
			dy = py[i] - y2;
			double d2 = dx*dx + dy*dy;

			if (d1<d2) { min = d1; xs = x1; ys = y1; }
			else { min = d2; xs = x2; ys = y2; }
		} //end-else

		  // Refine the search in the vicinity of (xs, ys)
		double delta = 0.5;
		double x = xs;
		while (1) {
			x += delta;

			double a = C;
			double b = B*x + E;
			double c = A*x*x + D*x + F;
			double det = b*b - 4 * a*c;
			if (det < 0) det = 0;

			double y1 = -(b + sqrt(det)) / (2 * a);
			double y2 = -(b - sqrt(det)) / (2 * a);

			dx = px[i] - x;
			dy = py[i] - y1;
			double d1 = dx*dx + dy*dy;

			dy = py[i] - y2;
			double d2 = dx*dx + dy*dy;

			if (d1 <= min) { min = d1; }
			else if (d2 <= min) { min = d2; }
			else break;
		} //end-while

		x = xs;
		while (1) {
			x -= delta;

			double a = C;
			double b = B*x + E;
			double c = A*x*x + D*x + F;
			double det = b*b - 4 * a*c;
			if (det < 0) det = 0;

			double y1 = -(b + sqrt(det)) / (2 * a);
			double y2 = -(b - sqrt(det)) / (2 * a);

			dx = px[i] - x;
			dy = py[i] - y1;
			double d1 = dx*dx + dy*dy;

			dy = py[i] - y2;
			double d2 = dx*dx + dy*dy;

			if (d1 <= min) { min = d1; }
			else if (d2 <= min) { min = d2; }
			else break;
		} //end-while

		error += min;
	} //end-for

	error = sqrt(error / noPoints);

	return error;
}